

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,Indent *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          StringTree *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  size_t sVar4;
  Branch *pBVar5;
  StringTree *extraout_RAX;
  size_t result;
  size_t sVar6;
  size_t result_2;
  long lVar7;
  char *pos;
  ulong __n;
  ulong local_b8 [2];
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t sStack_90;
  char *local_88;
  char *local_80;
  char *local_78;
  size_t sStack_70;
  char *local_68;
  String local_60;
  ArrayPtr<const_char> *local_48;
  StringTree *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_b8[0] = (ulong)(uint)this->size_;
  local_b8[1] = *(ulong *)(params + 2);
  local_a8 = params_1->size_;
  sStack_a0 = params_2->size_;
  local_98 = params_3->size_;
  sStack_90 = params_4->size_;
  local_88 = params_5->ptr;
  local_80 = (params_6->text).content.ptr;
  local_78 = params_7->ptr;
  sStack_70 = params_8->size_;
  local_68 = (params_9->text).content.ptr;
  sVar6 = 0;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_b8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x58);
  __return_storage_ptr__->size_ = sVar6;
  local_88 = (char *)0x0;
  local_78 = (char *)0x0;
  sStack_70 = 0;
  sVar6 = 0;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_b8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x58);
  local_40 = this;
  local_38 = params_1;
  heapString(&local_60,sVar6);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_88 = (char *)0x1;
  sVar6 = 0;
  local_80 = (char *)0x0;
  local_78 = (char *)0x1;
  sStack_70 = 1;
  local_68 = (char *)0x0;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_b8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x58);
  local_48 = params_2;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar6,sVar6,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar5;
  local_60.content.size_ = sVar6;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = sVar6;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (ulong)(uint)local_40->size_;
  if (__n != 0) {
    memset(pos,0x20,__n);
    pos = pos + __n;
  }
  sVar4 = *(size_t *)(params + 2);
  if (sVar4 != 0) {
    memcpy(pos,*(void **)params,sVar4);
    pos = pos + sVar4;
  }
  sVar4 = local_38->size_;
  if (sVar4 != 0) {
    memcpy(pos,local_38->ptr,sVar4);
    pos = pos + sVar4;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_48,params_3,params_4,(StringTree *)params_5,
             (ArrayPtr<const_char> *)params_6,(StringTree *)params_7,params_8,
             (ArrayPtr<const_char> *)params_9);
  return extraout_RAX;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}